

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

void all_different_imp(BoolView *b,vec<IntVar_*> *x,ConLevel cl)

{
  int iVar1;
  int iVar2;
  vec<IntView<4>_> *pvVar3;
  ulong uVar4;
  AllDiffBoundsImp<4> *this;
  AllDiffBoundsImp<0> *this_00;
  int iVar5;
  ulong uVar6;
  uint i_1;
  int iVar7;
  vec<IntView<0>_> local_98;
  BoolView *local_88;
  vec<IntView<4>_> local_80;
  vec<IntView<0>_> local_70;
  BoolView local_60;
  BoolView local_50;
  IntView<0> local_40;
  
  uVar4 = (ulong)x->sz;
  iVar7 = 0x7fffffff;
  iVar5 = -0x80000000;
  for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    iVar1 = (x->data[uVar6]->min).v;
    iVar2 = (x->data[uVar6]->max).v;
    if (iVar1 < iVar7) {
      iVar7 = iVar1;
    }
    if (iVar5 < iVar2) {
      iVar5 = iVar2;
    }
  }
  local_88 = b;
  if ((cl & ~CL_BND) == CL_DEF) {
    iVar5 = (iVar5 - iVar7) + 1;
    local_98.sz = 0;
    local_98.cap = 0;
    local_98.data = (IntView<0> *)0x0;
    for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      local_40.var = x->data[uVar6];
      local_40.a = 1;
      local_40.b = -iVar7;
      vec<IntView<0>_>::push(&local_98,&local_40);
      uVar4 = (ulong)x->sz;
    }
    if (iVar7 == 0) {
      this_00 = (AllDiffBoundsImp<0> *)operator_new(0x88);
      local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_50.v = local_88->v;
      local_50.s = local_88->s;
      vec<IntView<0>>::vec<IntView<0>>((vec<IntView<0>> *)&local_70,&local_98);
      pvVar3 = (vec<IntView<4>_> *)&local_70;
      AllDiffBoundsImp<0>::AllDiffBoundsImp(this_00,&local_50,&local_70,iVar5);
    }
    else {
      this = (AllDiffBoundsImp<4> *)operator_new(0x88);
      local_60.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_60.v = local_88->v;
      local_60.s = local_88->s;
      vec<IntView<4>>::vec<IntView<0>>((vec<IntView<4>> *)&local_80,&local_98);
      AllDiffBoundsImp<4>::AllDiffBoundsImp(this,&local_60,&local_80,iVar5);
      pvVar3 = &local_80;
    }
    free(pvVar3->data);
    pvVar3->data = (IntView<4> *)0x0;
    free(local_98.data);
    return;
  }
  fprintf(_stderr,"%s:%d: ","alldiff.cpp",0x3bc);
  fwrite("Not yet supported\n",0x12,1,_stderr);
  abort();
}

Assistant:

void all_different_imp(const BoolView& b, vec<IntVar*>& x, ConLevel cl) {
	int min = INT_MAX;
	int max = INT_MIN;
	for (unsigned int i = 0; i < x.size(); i++) {
		if (x[i]->getMin() < min) {
			min = x[i]->getMin();
		}
		if (x[i]->getMax() > max) {
			max = x[i]->getMax();
		}
	}
	const int range = max + 1 - min;
	if (!(cl == CL_BND || cl == CL_DEF)) {
		NOT_SUPPORTED;
	}
	vec<IntView<> > u;
	for (unsigned int i = 0; i < x.size(); i++) {
		u.push(IntView<>(x[i], 1, -min));
	}
	if (min == 0) {
		new AllDiffBoundsImp<0>(b, u, range);
	} else {
		new AllDiffBoundsImp<4>(b, u, range);
	}
}